

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lutf8lib.c
# Opt level: O0

char * utf8_decode(char *s,l_uint32 *val,int strict)

{
  int local_30;
  uint cc;
  int count;
  l_uint32 res;
  uint c;
  int strict_local;
  l_uint32 *val_local;
  char *s_local;
  
  count = (int)(byte)*s;
  cc = 0;
  val_local = (l_uint32 *)s;
  if (0x7f < (uint)count) {
    local_30 = 0;
    for (; (count & 0x40U) != 0; count = count << 1) {
      local_30 = local_30 + 1;
      if (((byte)s[local_30] & 0xc0) != 0x80) {
        return (char *)0x0;
      }
      cc = cc << 6 | (byte)s[local_30] & 0x3f;
    }
    count = (count & 0x7fU) << ((char)local_30 * '\x05' & 0x1fU) | cc;
    if (((5 < local_30) || (0x7fffffff < (uint)count)) ||
       ((uint)count < utf8_decode::limits[local_30])) {
      return (char *)0x0;
    }
    val_local = (l_uint32 *)(s + local_30);
  }
  cc = count;
  if ((strict == 0) || ((cc < 0x110000 && ((cc < 0xd800 || (0xdfff < cc)))))) {
    if (val != (l_uint32 *)0x0) {
      *val = cc;
    }
    s_local = (char *)((long)val_local + 1);
  }
  else {
    s_local = (char *)0x0;
  }
  return s_local;
}

Assistant:

static const char *utf8_decode (const char *s, l_uint32 *val, int strict) {
  static const l_uint32 limits[] =
        {~(l_uint32)0, 0x80, 0x800, 0x10000u, 0x200000u, 0x4000000u};
  unsigned int c = (unsigned char)s[0];
  l_uint32 res = 0;  /* final result */
  if (c < 0x80)  /* ascii? */
    res = c;
  else {
    int count = 0;  /* to count number of continuation bytes */
    for (; c & 0x40; c <<= 1) {  /* while it needs continuation bytes... */
      unsigned int cc = (unsigned char)s[++count];  /* read next byte */
      if (!iscont(cc))  /* not a continuation byte? */
        return NULL;  /* invalid byte sequence */
      res = (res << 6) | (cc & 0x3F);  /* add lower 6 bits from cont. byte */
    }
    res |= ((l_uint32)(c & 0x7F) << (count * 5));  /* add first byte */
    if (count > 5 || res > MAXUTF || res < limits[count])
      return NULL;  /* invalid byte sequence */
    s += count;  /* skip continuation bytes read */
  }
  if (strict) {
    /* check for invalid code points; too large or surrogates */
    if (res > MAXUNICODE || (0xD800u <= res && res <= 0xDFFFu))
      return NULL;
  }
  if (val) *val = res;
  return s + 1;  /* +1 to include first byte */
}